

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_RDI;
  allocator<char> *__a;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char *xml_output_file_env;
  allocator<char> local_12;
  undefined1 local_11;
  string *default_value_for_output_flag;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"",&local_12);
  std::allocator<char>::~allocator(&local_12);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          posix::GetEnv("XML_OUTPUT_FILE");
  if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    __a = &local_71;
    local_30 = __lhs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"xml:",__a);
    std::operator+(__lhs,(char *)__a);
    std::__cxx11::string::operator=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return in_RDI;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar(){
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (NULL != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}